

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle4<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_146;
  allocator<char> local_145;
  TestShaderType local_144;
  ulong local_140;
  undefined8 local_138;
  string example_struct_end;
  string local_110 [32];
  string local_f0 [32];
  string example_struct_begin;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string shader_source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct_begin,"struct light {\n",
             (allocator<char> *)&example_struct_end);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example_struct_end,"};\n\n",(allocator<char> *)&shader_source);
  local_138 = 1;
  local_144 = tested_shader_type;
  local_140 = (ulong)tested_shader_type;
  std::__cxx11::string::string((string *)&shader_source,(string *)&example_struct_begin);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"    float",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"[2]",&local_146);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_70,this,local_f0,local_90,local_138);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_110," x",&local_145);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"[2]",&local_146);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_70,this,local_110,local_b0,7);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_144) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x645);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b8771d::switchdataD_0171c02c +
         (long)(int)(&switchD_00b8771d::switchdataD_0171c02c)[local_140]) {
  case 0xb8771f:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb87730:
  case 0xb87737:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171c044 + *(int *)(&DAT_0171c044 + local_140 * 4)))
            (&DAT_0171c044 + *(int *)(&DAT_0171c044 + local_140 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct_begin("struct light {\n");
	std::string example_struct_end("};\n\n");

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = example_struct_begin;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";
		shader_source += example_struct_end;
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}